

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall fmt::v11::detail::print(detail *this,FILE *f,string_view text)

{
  char *pcVar1;
  undefined8 uVar2;
  uint *puVar3;
  string_view fmt;
  
  pcVar1 = (char *)fwrite(f,1,(size_t)text.data_,(FILE *)this);
  if (text.data_ <= pcVar1) {
    return;
  }
  uVar2 = __cxa_allocate_exception(0x20);
  puVar3 = (uint *)__errno_location();
  fmt.data_ = (char *)(ulong)*puVar3;
  fmt.size_ = (size_t)"cannot write to file";
  vsystem_error((int)uVar2,fmt,(format_args)ZEXT816(0x14));
  __cxa_throw(uVar2,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

FMT_FUNC void print(std::FILE* f, string_view text) {
#if defined(_WIN32) && !defined(FMT_USE_WRITE_CONSOLE)
  int fd = _fileno(f);
  if (_isatty(fd)) {
    std::fflush(f);
    if (write_console(fd, text)) return;
  }
#endif
  fwrite_all(text.data(), text.size(), f);
}